

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

bool __thiscall draco::OctahedronToolBox::SetQuantizationBits(OctahedronToolBox *this,int32_t q)

{
  int32_t q_local;
  OctahedronToolBox *this_local;
  bool local_1;
  
  if ((q < 2) || (0x1e < q)) {
    local_1 = false;
  }
  else {
    this->quantization_bits_ = q;
    this->max_quantized_value_ = (1 << ((byte)this->quantization_bits_ & 0x1f)) + -1;
    this->max_value_ = this->max_quantized_value_ + -1;
    this->dequantization_scale_ = 2.0 / (float)this->max_value_;
    this->center_value_ = this->max_value_ / 2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SetQuantizationBits(int32_t q) {
    if (q < 2 || q > 30) {
      return false;
    }
    quantization_bits_ = q;
    max_quantized_value_ = (1u << quantization_bits_) - 1;
    max_value_ = max_quantized_value_ - 1;
    dequantization_scale_ = 2.f / max_value_;
    center_value_ = max_value_ / 2;
    return true;
  }